

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_exception.h
# Opt level: O1

void __thiscall rcdiscover::SocketException::~SocketException(SocketException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__SocketException_0011fca0;
  pcVar2 = (this->msg_)._M_dataplus._M_p;
  paVar1 = &(this->msg_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

virtual ~SocketException() = default;